

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  source_loc loc_03;
  source_loc loc_04;
  undefined4 uVar1;
  logger *plVar2;
  int __how;
  int __fd;
  _Any_data *p_Var4;
  long lVar5;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  initializer_list_t init_03;
  initializer_list_t init_04;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  string_view_t fmt_02;
  string_view_t fmt_03;
  string_view_t fmt_04;
  _Head_base<0UL,_spdlog::populators::date_time_populator_*,_false> local_1460;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1458;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1438;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_1428;
  undefined1 local_1420;
  undefined1 local_1418 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_1408;
  undefined1 local_1400;
  undefined1 local_13f8 [16];
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_13e8;
  undefined1 local_13c8 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_13b8;
  undefined1 local_13b0;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_13a8;
  value_t local_1388 [8];
  undefined8 local_1380;
  value_t *local_1378;
  undefined1 local_1370;
  undefined1 local_1368 [16];
  iterator local_1358;
  bool local_1350;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1348;
  value_t local_1328 [8];
  undefined8 local_1320;
  value_t *local_1318;
  undefined1 local_1310;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1308;
  value_t local_12e8 [8];
  undefined8 local_12e0;
  value_t *local_12d8;
  undefined1 local_12d0;
  _Any_data local_12c8;
  code *local_12b8;
  code *local_12b0;
  executor local_1110;
  executor local_f60;
  executor local_db0;
  executor local_c00;
  executor local_a50;
  executor local_8a0;
  executor local_6f0;
  executor local_540;
  executor local_390;
  executor local_1e0;
  _Any_data *p_Var3;
  
  load_levels_example();
  spdlog::default_logger_raw();
  local_1458.value_ref = (value_type *)0x0;
  local_1458.owned_value.m_type = null;
  local_1458.owned_value._1_7_ = 0;
  local_1458.owned_value.m_value.object = (object_t *)0x0;
  spdlog::logger::log((logger *)&local_12c8,0.0);
  local_13e8.owned_value.m_value.object = (object_t *)0x0;
  local_13e8.owned_value.m_type = 3;
  local_13e8.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[8]>((char (*) [8])"version");
  local_13e8.value_ref = &local_13e8.owned_value;
  local_13e8.is_rvalue = true;
  local_13a8.owned_value.m_value.object = (object_t *)0x0;
  local_13a8.owned_value.m_type = string;
  local_13a8.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])"major");
  local_13a8.value_ref = &local_13a8.owned_value;
  local_13a8.is_rvalue = true;
  local_1378 = local_1388;
  local_1388[0] = number_integer;
  local_1380 = 1;
  local_1370 = 1;
  init._M_len = 2;
  init._M_array = (iterator)local_13a8.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_1458.owned_value,init,true,array);
  local_1458.value_ref = &local_1458.owned_value;
  local_1458.is_rvalue = true;
  local_1308.owned_value.m_value.object = (object_t *)0x0;
  local_1308.owned_value.m_type = string;
  local_1308.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])"minor");
  local_1308.value_ref = &local_1308.owned_value;
  local_1308.is_rvalue = true;
  local_12d8 = local_12e8;
  local_12e8[0] = number_integer;
  local_12e0 = 9;
  local_12d0 = 1;
  init_00._M_len = 2;
  init_00._M_array = (iterator)local_1308.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_1438,init_00,true,array);
  local_1420 = 1;
  local_1348.owned_value.m_value.object = (object_t *)0x0;
  local_1348.owned_value.m_type = string;
  local_1428 = &local_1438;
  local_1348.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])"patch");
  local_1348.value_ref = &local_1348.owned_value;
  local_1348.is_rvalue = true;
  local_1318 = local_1328;
  local_1328[0] = number_integer;
  local_1320 = 2;
  local_1310 = 1;
  init_01._M_len = 2;
  init_01._M_array = (iterator)local_1348.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_1418,init_01,true,array);
  local_1400 = 1;
  init_02._M_len = 3;
  init_02._M_array = &local_1458;
  local_1408 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_1418;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_13c8,init_02,true,array);
  local_13b0 = 1;
  init_03._M_len = 2;
  init_03._M_array = &local_13e8;
  local_13b8 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_13c8;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_1368,init_03,true,array);
  local_1350 = true;
  init_04._M_len = 1;
  init_04._M_array = (iterator)local_1368;
  local_1358 = (iterator)local_1368;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_13f8,init_04,true,array);
  spdlog::details::executor::operator()((executor *)&local_12c8,(json *)local_13f8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_13f8 + 8),local_13f8[0]);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_1368 + 8),local_1368[0]);
  lVar5 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)(local_13c8 + lVar5 + 8),local_13c8[lVar5]);
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  lVar5 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)(local_1418 + lVar5 + 8),local_1418[lVar5]);
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x60);
  lVar5 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)((long)&local_1320 + lVar5),local_1328[lVar5]);
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  lVar5 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)((long)&local_12e0 + lVar5),local_12e8[lVar5]);
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  lVar5 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)((long)&local_1380 + lVar5),local_1388[lVar5]);
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  spdlog::details::executor::~executor((executor *)&local_12c8);
  local_1458.owned_value.m_type = binary|boolean;
  local_1458.owned_value._1_3_ = 0;
  plVar2 = spdlog::default_logger_raw();
  local_12b8 = (code *)0x0;
  local_12c8._M_unused._M_object = (void *)0x0;
  local_12c8._8_8_ = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 0x23;
  fmt.data_ = "Easy padding in numbers like {:08d}";
  spdlog::logger::log_<int>(&local_1e0,plVar2,loc,warn,fmt,(int *)&local_1458);
  spdlog::details::executor::~executor(&local_1e0);
  local_1458.owned_value._0_4_ = 0x2a;
  plVar2 = spdlog::default_logger_raw();
  local_12b8 = (code *)0x0;
  local_12c8._M_unused._M_object = (void *)0x0;
  local_12c8._8_8_ = 0;
  loc_00.funcname = (char *)0x0;
  loc_00.filename = (char *)0x0;
  loc_00.line = 0;
  loc_00._12_4_ = 0;
  fmt_00.size_ = 0x3c;
  fmt_00.data_ = "Support for int: {0:d};  hex: {0:x};  oct: {0:o}; bin: {0:b}";
  spdlog::logger::log_<int>(&local_390,plVar2,loc_00,critical,fmt_00,(int *)&local_1458);
  spdlog::details::executor::~executor(&local_390);
  local_1458.owned_value._0_8_ = &DAT_3ff3c0c1fc8f3238;
  plVar2 = spdlog::default_logger_raw();
  local_12b8 = (code *)0x0;
  local_12c8._M_unused._M_object = (void *)0x0;
  local_12c8._8_8_ = 0;
  loc_01.funcname = (char *)0x0;
  loc_01.filename = (char *)0x0;
  loc_01.line = 0;
  loc_01._12_4_ = 0;
  fmt_01.size_ = 0x1b;
  fmt_01.data_ = "Support for floats {:03.2f}";
  spdlog::logger::log_<double>(&local_540,plVar2,loc_01,info,fmt_01,(double *)&local_1458);
  spdlog::details::executor::~executor(&local_540);
  plVar2 = spdlog::default_logger_raw();
  local_12b8 = (code *)0x0;
  local_12c8._M_unused._M_object = (void *)0x0;
  local_12c8._8_8_ = 0;
  loc_02.funcname = (char *)0x0;
  loc_02.filename = (char *)0x0;
  loc_02.line = 0;
  loc_02._12_4_ = 0;
  fmt_02.size_ = 0x1d;
  fmt_02.data_ = "Positional args are {1} {0}..";
  spdlog::logger::log_<char_const(&)[4],char_const(&)[10]>
            (&local_6f0,plVar2,loc_02,info,fmt_02,(char (*) [4])"too",(char (*) [10])"supported");
  spdlog::details::executor::~executor(&local_6f0);
  plVar2 = spdlog::default_logger_raw();
  local_12b8 = (code *)0x0;
  local_12c8._M_unused._M_object = (void *)0x0;
  local_12c8._8_8_ = 0;
  loc_03.funcname = (char *)0x0;
  loc_03.filename = (char *)0x0;
  loc_03.line = 0;
  loc_03._12_4_ = 0;
  fmt_03.size_ = 0x1c;
  fmt_03.data_ = "{:>8} aligned, {:<8} aligned";
  spdlog::logger::log_<char_const(&)[6],char_const(&)[5]>
            (&local_8a0,plVar2,loc_03,info,fmt_03,(char (*) [6])"right",(char (*) [5])"left");
  spdlog::details::executor::~executor(&local_8a0);
  spdlog::set_level(info);
  spdlog::default_logger_raw();
  local_12b8 = (code *)0x0;
  local_12c8._M_unused._M_object = (void *)0x0;
  local_12c8._8_8_ = 0;
  spdlog::logger::log((logger *)&local_a50,0.0);
  spdlog::details::executor::~executor(&local_a50);
  spdlog::set_level(trace);
  spdlog::default_logger_raw();
  local_12b8 = (code *)0x0;
  local_12c8._M_unused._M_object = (long *)0x0;
  local_12c8._8_8_ = 0;
  spdlog::logger::log((logger *)&local_c00,0.0);
  spdlog::details::executor::~executor(&local_c00);
  spdlog::details::make_unique<spdlog::populators::date_time_populator>();
  spdlog::details::make_unique<spdlog::populators::level_populator>();
  local_13e8.owned_value._0_8_ = operator_new(8);
  ((thread_id_populator *)local_13e8.owned_value._0_8_)->super_populator =
       (populator)&PTR__populator_00159c70;
  spdlog::details::make_unique<spdlog::populators::message_populator>();
  spdlog::
  set_populators<std::unique_ptr<spdlog::populators::date_time_populator,std::default_delete<spdlog::populators::date_time_populator>>,std::unique_ptr<spdlog::populators::level_populator,std::default_delete<spdlog::populators::level_populator>>,std::unique_ptr<spdlog::populators::thread_id_populator,std::default_delete<spdlog::populators::thread_id_populator>>,std::unique_ptr<spdlog::populators::message_populator,std::default_delete<spdlog::populators::message_populator>>>
            ((unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
              *)&local_12c8,
             (unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
              *)&local_1458,
             (unique_ptr<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
              *)&local_13e8,
             (unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
              *)&local_13a8);
  if ((long *)CONCAT71(local_13a8.owned_value._1_7_,local_13a8.owned_value.m_type) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_13a8.owned_value._1_7_,local_13a8.owned_value.m_type) + 8))
              ();
  }
  if ((_Tuple_impl<0UL,_spdlog::populators::thread_id_populator_*,_std::default_delete<spdlog::populators::thread_id_populator>_>
       )local_13e8.owned_value._0_8_ != (thread_id_populator *)0x0) {
    (**(code **)(*(long *)local_13e8.owned_value._0_8_ + 8))();
  }
  if ((long *)local_1458.owned_value._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1458.owned_value._0_8_ + 8))();
  }
  if ((long *)local_12c8._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_12c8._M_unused._M_object + 8))();
  }
  spdlog::default_logger_raw();
  local_12b8 = (code *)0x0;
  local_12c8._M_unused._M_object = (void *)0x0;
  local_12c8._8_8_ = 0;
  spdlog::logger::log((logger *)&local_db0,0.0);
  spdlog::details::executor::~executor(&local_db0);
  spdlog::set_populators<>();
  spdlog::default_logger_raw();
  local_12b8 = (code *)0x0;
  local_12c8._M_unused._M_object = (void *)0x0;
  local_12c8._8_8_ = 0;
  spdlog::logger::log((logger *)&local_f60,0.0);
  spdlog::details::executor::~executor(&local_f60);
  spdlog::details::make_unique<spdlog::json_formatter>();
  local_1460._M_head_impl = (date_time_populator *)local_12c8._M_unused._0_8_;
  local_12c8._M_unused._M_object = (long *)0x0;
  spdlog::set_formatter
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)&local_1460);
  if (local_1460._M_head_impl != (date_time_populator *)0x0) {
    (*((local_1460._M_head_impl)->super_pattern_populator).super_populator._vptr_populator[1])();
  }
  local_1460._M_head_impl = (date_time_populator *)0x0;
  if ((long *)local_12c8._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_12c8._M_unused._M_object + 8))();
  }
  spdlog::set_level(info);
  spdlog::enable_backtrace(10);
  local_1458.owned_value._0_8_ = local_1458.owned_value._0_8_ & 0xffffffff00000000;
  do {
    plVar2 = spdlog::default_logger_raw();
    local_12c8._M_unused._M_object = (long *)0x0;
    local_12c8._8_8_ = 0;
    local_12b8 = (code *)0x0;
    loc_04.funcname = (char *)0x0;
    loc_04.filename = (char *)0x0;
    loc_04.line = 0;
    loc_04._12_4_ = 0;
    fmt_04.size_ = 0x14;
    fmt_04.data_ = "Backtrace message {}";
    spdlog::logger::log_<int&>(&local_1110,plVar2,loc_04,debug,fmt_04,(int *)&local_1458);
    __how = (int)plVar2;
    spdlog::details::executor::~executor(&local_1110);
    uVar1 = local_1458.owned_value._0_4_;
    local_1458.owned_value._0_4_ = local_1458.owned_value._0_4_ + 1;
  } while ((int)uVar1 < 99);
  spdlog::dump_backtrace();
  stdout_logger_example();
  basic_example();
  rotating_example();
  daily_example();
  async_example();
  binary_example();
  multi_sink_example();
  user_defined_example();
  spdlog::set_error_handler(err_handler_example()::$_0::__invoke(std::__cxx11::string_const__);
  trace_example();
  stopwatch_example();
  udp_example();
  custom_flags_example();
  spdlog::flush_every((seconds)0x3);
  p_Var3 = &local_12c8;
  local_12c8._M_unused._M_object = (void *)0x0;
  local_12c8._8_8_ = 0;
  local_12b0 = std::
               _Function_handler<void_(std::shared_ptr<spdlog::logger>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/takeshibaconsuzuki[P]structlog/example/example.cpp:105:27)>
               ::_M_invoke;
  local_12b8 = std::
               _Function_handler<void_(std::shared_ptr<spdlog::logger>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/takeshibaconsuzuki[P]structlog/example/example.cpp:105:27)>
               ::_M_manager;
  spdlog::apply_all((function<void_(std::shared_ptr<spdlog::logger>)> *)p_Var3);
  __fd = (int)p_Var3;
  if (local_12b8 != (code *)0x0) {
    p_Var3 = &local_12c8;
    p_Var4 = p_Var3;
    (*local_12b8)(p_Var3,p_Var3,__destroy_functor);
    __fd = (int)p_Var4;
    __how = (int)p_Var3;
  }
  spdlog::shutdown(__fd,__how);
  return 0;
}

Assistant:

int main(int, char *[])
{
    // Log levels can be loaded from argv/env using "SPDLOG_LEVEL"
    load_levels_example();

#ifdef SPDLOG_JSON_LOGGER
    spdlog::info("Welcome to spdlog!")(
        {{"version", {{"major", SPDLOG_VER_MAJOR}, {"minor", SPDLOG_VER_MINOR}, {"patch", SPDLOG_VER_PATCH}}}});
#else
    spdlog::info("Welcome to spdlog version {}.{}.{}  !", SPDLOG_VER_MAJOR, SPDLOG_VER_MINOR, SPDLOG_VER_PATCH);
#endif

    spdlog::warn("Easy padding in numbers like {:08d}", 12);
    spdlog::critical("Support for int: {0:d};  hex: {0:x};  oct: {0:o}; bin: {0:b}", 42);
    spdlog::info("Support for floats {:03.2f}", 1.23456);
    spdlog::info("Positional args are {1} {0}..", "too", "supported");
    spdlog::info("{:>8} aligned, {:<8} aligned", "right", "left");

    // Runtime log levels
    spdlog::set_level(spdlog::level::info); // Set global log level to info
    spdlog::debug("This message should not be displayed!");
    spdlog::set_level(spdlog::level::trace); // Set specific logger's log level
    spdlog::debug("This message should be displayed..");

    // Customize msg format for all loggers
#ifdef SPDLOG_JSON_LOGGER
    spdlog::set_populators(
        spdlog::details::make_unique<spdlog::populators::date_time_populator>(),
        spdlog::details::make_unique<spdlog::populators::level_populator>(),
        spdlog::details::make_unique<spdlog::populators::thread_id_populator>(),
        spdlog::details::make_unique<spdlog::populators::message_populator>());
    spdlog::info("This is an info message with custom populators");
    spdlog::set_populators();
    spdlog::info("This should log an empty json object");
#else
    spdlog::set_pattern("[%H:%M:%S %z] [%^%L%$] [thread %t] %v");
    spdlog::info("This an info message with custom format");
#endif
    spdlog::set_formatter(spdlog::details::make_unique<spdlog::default_formatter>()); // back to default format
    spdlog::set_level(spdlog::level::info);

    // Backtrace support
    // Loggers can store in a ring buffer all messages (including debug/trace) for later inspection.
    // When needed, call dump_backtrace() to see what happened:
    spdlog::enable_backtrace(10); // create ring buffer with capacity of 10  messages
    for (int i = 0; i < 100; i++)
    {
        spdlog::debug("Backtrace message {}", i); // not logged..
    }
    // e.g. if some error happened:
    spdlog::dump_backtrace(); // log them now!

    try
    {
        stdout_logger_example();
        basic_example();
        rotating_example();
        daily_example();
        async_example();
        binary_example();
        multi_sink_example();
        user_defined_example();
        err_handler_example();
        trace_example();
        stopwatch_example();
        udp_example();
        custom_flags_example();

        // Flush all *registered* loggers using a worker thread every 3 seconds.
        // note: registered loggers *must* be thread safe for this to work correctly!
        spdlog::flush_every(std::chrono::seconds(3));

        // Apply some function on all registered loggers
        spdlog::apply_all([&](std::shared_ptr<spdlog::logger> l) { l->info("End of example."); });

        // Release all spdlog resources, and drop all loggers in the registry.
        // This is optional (only mandatory if using windows + async log).
        spdlog::shutdown();
    }

    // Exceptions will only be thrown upon failed logger or sink construction (not during logging).
    catch (const spdlog::spdlog_ex &ex)
    {
        std::printf("Log initialization failed: %s\n", ex.what());
        return 1;
    }
}